

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O2

int zt_opt_long(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error)

{
  char *__nptr;
  int *piVar1;
  long lVar2;
  int args_consumed;
  char *end;
  
  end = (char *)0x0;
  args_consumed = 0;
  __nptr = zt_opt_get_value(argn,defn,argv,def,&args_consumed,error);
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = strtol(__nptr,&end,0);
  if (*piVar1 != 0) {
    (*error)(*piVar1,"invalid number \'%s\'",__nptr);
  }
  if ((end != (char *)0x0) && (*end != '\0')) {
    (*error)(0x16,"\'%s\' is not a number",__nptr);
  }
  if ((long *)def[defn].cb_data != (long *)0x0) {
    *(long *)def[defn].cb_data = lVar2;
  }
  return args_consumed;
}

Assistant:

int
zt_opt_long(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    long   result;
    char * end = NULL;
    int    args_consumed = 0;
    char * arg = zt_opt_get_value(argn, defn, argv, def, &args_consumed, error);

    errno  = 0;
    result = strtol(arg, &end, 0);

    if (errno) {
        /* check errno */
        error(errno, "invalid number '%s'", arg);
    }

    if (end && *end) {
        /* invalid character */
        error(EINVAL, "'%s' is not a number", arg);
    }

    if (def[defn].cb_data) {
        *(long *)def[defn].cb_data = result;
    }

    return args_consumed;
}